

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

void __thiscall XPMP2::Aircraft::SoundRemoveAll(Aircraft *this)

{
  ChnListTy *this_00;
  uint uVar1;
  long lVar2;
  _List_node_base *p_Var3;
  undefined8 local_40 [4];
  
  if (gpSndSys != (long *)0x0) {
    this_00 = &this->chnList;
    p_Var3 = (_List_node_base *)this_00;
    if ((((this->chnList).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          _M_node.super__List_node_base._M_next != (_List_node_base *)this_00) &&
        (DAT_002cc444 == '\x01')) && (glob < 1)) {
      uVar1 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_40,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x3be,"SoundRemoveAll",logDEBUG,"Aircraft %08X (%s): Removed all sounds",(ulong)uVar1,
             local_40[0]);
      std::__cxx11::string::~string((string *)local_40);
    }
    while (p_Var3 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var3->_M_next)
                    ->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)this_00) {
      (**(code **)(*gpSndSys + 0x28))(gpSndSys,p_Var3[1]._M_next);
    }
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear(this_00);
    for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x18) {
      *(undefined8 *)((long)&this->aSndCh[0].chnId + lVar2) = 0;
    }
  }
  return;
}

Assistant:

void Aircraft::SoundRemoveAll ()
{
    if (!gpSndSys) return;

    // Log a message only if there actually is anything to stop
    if (!chnList.empty()) {
        LOG_MATCHING(logDEBUG, "Aircraft %08X (%s): Removed all sounds",
                     modeS_id, GetFlightId().c_str());
    }

    // All channels now to be stopped
    for (uint64_t sndId: chnList) gpSndSys->Stop(sndId);
    chnList.clear();
    for (SndChTy &sndChn: aSndCh) sndChn.chnId = 0;
}